

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O3

ll_elem * pred(ll_head *q_head,ll_elem *n)

{
  elem_ptr_t *peVar1;
  long *plVar2;
  atomic_size_t *paVar3;
  ulong *puVar4;
  atomic_size_t aVar5;
  ulong uVar6;
  long lVar7;
  ll_elem *plVar8;
  ll_elem *plVar9;
  ulong uVar10;
  ll_elem *plVar11;
  ll_elem *plVar12;
  ulong uVar13;
  ll_elem *old;
  bool bVar14;
  
  if (((ulong)q_head & 3) != 0) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x147,
                  "struct ll_elem *pred(struct ll_head *, struct ll_elem *)");
  }
  plVar11 = (ll_elem *)((ulong)n & 0xfffffffffffffffc);
  if (plVar11 == (ll_elem *)0x0) {
    __assert_fail("n != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x149,
                  "struct ll_elem *pred(struct ll_head *, struct ll_elem *)");
  }
  peVar1 = &plVar11->pred;
  plVar9 = (ll_elem *)plVar11->pred;
  do {
    LOCK();
    plVar8 = (ll_elem *)*peVar1;
    bVar14 = plVar9 == plVar8;
    if (bVar14) {
      *peVar1 = (ulong)plVar9 | 1;
      plVar8 = plVar9;
    }
    UNLOCK();
    plVar9 = plVar8;
  } while (!bVar14);
  while (((ulong)plVar8 & 1) != 0) {
    plVar9 = (ll_elem *)*peVar1;
    do {
      LOCK();
      plVar8 = (ll_elem *)*peVar1;
      bVar14 = plVar9 == plVar8;
      if (bVar14) {
        *peVar1 = (ulong)plVar9 | 1;
        plVar8 = plVar9;
      }
      UNLOCK();
      plVar9 = plVar8;
    } while (!bVar14);
  }
  if (((ulong)plVar8 & 0xfffffffffffffffc) == 0) {
    LOCK();
    uVar10 = *peVar1;
    *peVar1 = *peVar1 & 0xfffffffffffffffe;
    UNLOCK();
    if ((uVar10 & 1) != 0) {
      return plVar8;
    }
  }
  else {
    LOCK();
    plVar2 = (long *)(((ulong)plVar8 & 0xfffffffffffffffc) + 0x10);
    *plVar2 = *plVar2 + 1;
    UNLOCK();
    LOCK();
    uVar10 = *peVar1;
    *peVar1 = *peVar1 & 0xfffffffffffffffe;
    UNLOCK();
    if ((uVar10 & 1) != 0) {
      do {
        plVar9 = plVar8;
        if (((ulong)plVar8 & 2) == 0) {
          plVar8 = succ(q_head,plVar8);
          if (plVar8 < (ll_elem *)0x4) {
            __assert_fail("ptr_clear(ps) != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c"
                          ,0x15f,"struct ll_elem *pred(struct ll_head *, struct ll_elem *)");
          }
          while ((plVar12 = (ll_elem *)((ulong)plVar8 & 0xfffffffffffffffc), plVar12 != plVar11 &&
                 (((ulong)plVar9 & 2) == 0))) {
            if (((ulong)plVar9 & 1) != 0) goto LAB_00101e93;
            do {
              LOCK();
              plVar8 = (ll_elem *)*peVar1;
              bVar14 = plVar9 == plVar8;
              if (bVar14) {
                *peVar1 = (ulong)plVar12 | 1;
                plVar8 = plVar9;
              }
              UNLOCK();
              if (bVar14) {
                LOCK();
                plVar12->refcnt = plVar12->refcnt + 1;
                UNLOCK();
                LOCK();
                uVar10 = *peVar1;
                *peVar1 = *peVar1 & 0xfffffffffffffffe;
                UNLOCK();
                if ((uVar10 & 1) == 0) goto LAB_00101eb2;
                LOCK();
                paVar3 = &plVar9->refcnt;
                uVar10 = *paVar3;
                *paVar3 = *paVar3 - 2;
                UNLOCK();
                if (1 < uVar10) goto LAB_00101cc1;
                goto LAB_00101e74;
              }
            } while ((ll_elem *)((ulong)plVar8 & 0xfffffffffffffffe) == plVar9);
            LOCK();
            paVar3 = &plVar12->refcnt;
            aVar5 = *paVar3;
            *paVar3 = *paVar3 - 1;
            UNLOCK();
            if (aVar5 == 0) goto LAB_00101e74;
            LOCK();
            paVar3 = &plVar9->refcnt;
            aVar5 = *paVar3;
            *paVar3 = *paVar3 - 1;
            UNLOCK();
            if (aVar5 == 0) goto LAB_00101e74;
            plVar9 = (ll_elem *)*peVar1;
            do {
              LOCK();
              plVar12 = (ll_elem *)*peVar1;
              bVar14 = plVar9 == plVar12;
              if (bVar14) {
                *peVar1 = (ulong)plVar9 | 1;
                plVar12 = plVar9;
              }
              UNLOCK();
              plVar9 = plVar12;
            } while (!bVar14);
            while (((ulong)plVar12 & 1) != 0) {
              plVar9 = (ll_elem *)*peVar1;
              do {
                LOCK();
                plVar12 = (ll_elem *)*peVar1;
                bVar14 = plVar9 == plVar12;
                if (bVar14) {
                  *peVar1 = (ulong)plVar9 | 1;
                  plVar12 = plVar9;
                }
                UNLOCK();
                plVar9 = plVar12;
              } while (!bVar14);
            }
            if (((ulong)plVar12 & 0xfffffffffffffffc) != 0) {
              LOCK();
              plVar2 = (long *)(((ulong)plVar12 & 0xfffffffffffffffc) + 0x10);
              *plVar2 = *plVar2 + 1;
              UNLOCK();
            }
            LOCK();
            uVar10 = *peVar1;
            *peVar1 = *peVar1 & 0xfffffffffffffffe;
            UNLOCK();
            if ((uVar10 & 1) == 0) goto LAB_00101ed1;
LAB_00101cc1:
            plVar8 = succ(q_head,plVar12);
            plVar9 = plVar12;
          }
          LOCK();
          paVar3 = &plVar12->refcnt;
          aVar5 = *paVar3;
          *paVar3 = *paVar3 - 1;
          UNLOCK();
          if (aVar5 == 0) goto LAB_00101e74;
        }
        uVar10 = (ulong)plVar9 & 0xfffffffffffffffc;
        if ((*(ulong *)(uVar10 + 8) & 2) == 0) {
          return (ll_elem *)((uint)*peVar1 & 2 | uVar10);
        }
        puVar4 = (ulong *)(uVar10 + 8);
        plVar12 = (ll_elem *)*puVar4;
        do {
          LOCK();
          plVar8 = (ll_elem *)*puVar4;
          bVar14 = plVar12 == plVar8;
          if (bVar14) {
            *puVar4 = (ulong)plVar12 | 1;
            plVar8 = plVar12;
          }
          UNLOCK();
          plVar12 = plVar8;
        } while (!bVar14);
        while (((ulong)plVar8 & 1) != 0) {
          plVar12 = (ll_elem *)*puVar4;
          do {
            LOCK();
            plVar8 = (ll_elem *)*puVar4;
            bVar14 = plVar12 == plVar8;
            if (bVar14) {
              *puVar4 = (ulong)plVar12 | 1;
              plVar8 = plVar12;
            }
            UNLOCK();
            plVar12 = plVar8;
          } while (!bVar14);
        }
        uVar13 = (ulong)plVar8 & 0xfffffffffffffffc;
        if (uVar13 != 0) {
          LOCK();
          *(long *)(uVar13 + 0x10) = *(long *)(uVar13 + 0x10) + 1;
          UNLOCK();
        }
        LOCK();
        uVar6 = *puVar4;
        *puVar4 = *puVar4 & 0xfffffffffffffffe;
        UNLOCK();
        if ((uVar6 & 1) == 0) break;
        if (((ulong)plVar9 & 1) != 0) {
LAB_00101e93:
          __assert_fail("!((uintptr_t)old & DEREF)",
                        "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                        0xdb,"int ptr_cas(elem_ptr_t *, struct ll_elem **, struct ll_elem *)");
        }
        do {
          LOCK();
          plVar12 = (ll_elem *)*peVar1;
          bVar14 = plVar9 == plVar12;
          if (bVar14) {
            *peVar1 = ((uint)plVar9 & 2) + uVar13 + 1;
            plVar12 = plVar9;
          }
          UNLOCK();
          if (bVar14) {
            LOCK();
            *(long *)(uVar13 + 0x10) = *(long *)(uVar13 + 0x10) + 1;
            UNLOCK();
            LOCK();
            uVar13 = *peVar1;
            *peVar1 = *peVar1 & 0xfffffffffffffffe;
            UNLOCK();
            if ((uVar13 & 1) == 0) {
LAB_00101eb2:
              __assert_fail("p & DEREF",
                            "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c"
                            ,0xf5,"void ptr_clear_deref(elem_ptr_t *)");
            }
            LOCK();
            puVar4 = (ulong *)(uVar10 + 0x10);
            uVar10 = *puVar4;
            *puVar4 = *puVar4 - 2;
            UNLOCK();
            if (1 < uVar10) goto LAB_00101e23;
            goto LAB_00101e74;
          }
        } while ((ll_elem *)((ulong)plVar12 & 0xfffffffffffffffe) == plVar9);
        LOCK();
        plVar2 = (long *)(uVar10 + 0x10);
        lVar7 = *plVar2;
        *plVar2 = *plVar2 + -1;
        UNLOCK();
        if (lVar7 == 0) {
LAB_00101e74:
          __assert_fail("old >= count",
                        "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                        0x9a,"void deref_release(struct ll_head *, struct ll_elem *, size_t)");
        }
        LOCK();
        plVar2 = (long *)(uVar13 + 0x10);
        lVar7 = *plVar2;
        *plVar2 = *plVar2 + -1;
        UNLOCK();
        if (lVar7 == 0) goto LAB_00101e74;
        plVar9 = (ll_elem *)*peVar1;
        do {
          LOCK();
          plVar8 = (ll_elem *)*peVar1;
          bVar14 = plVar9 == plVar8;
          if (bVar14) {
            *peVar1 = (ulong)plVar9 | 1;
            plVar8 = plVar9;
          }
          UNLOCK();
          plVar9 = plVar8;
        } while (!bVar14);
        while (((ulong)plVar8 & 1) != 0) {
          plVar9 = (ll_elem *)*peVar1;
          do {
            LOCK();
            plVar8 = (ll_elem *)*peVar1;
            bVar14 = plVar9 == plVar8;
            if (bVar14) {
              *peVar1 = (ulong)plVar9 | 1;
              plVar8 = plVar9;
            }
            UNLOCK();
            plVar9 = plVar8;
          } while (!bVar14);
        }
        if (((ulong)plVar8 & 0xfffffffffffffffc) != 0) {
          LOCK();
          plVar2 = (long *)(((ulong)plVar8 & 0xfffffffffffffffc) + 0x10);
          *plVar2 = *plVar2 + 1;
          UNLOCK();
        }
        LOCK();
        uVar10 = *peVar1;
        *peVar1 = *peVar1 & 0xfffffffffffffffe;
        UNLOCK();
        if ((uVar10 & 1) == 0) break;
LAB_00101e23:
        if (plVar8 < (ll_elem *)0x4) {
          __assert_fail("ptr_clear(p) != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                        0x155,"struct ll_elem *pred(struct ll_head *, struct ll_elem *)");
        }
      } while( true );
    }
  }
LAB_00101ed1:
  __assert_fail("old & DEREF",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0xb0,
                "struct ll_elem *deref(elem_ptr_t *)");
}

Assistant:

static struct ll_elem*
pred(struct ll_head *q_head, struct ll_elem *n)
{
	struct ll_elem	*q, *p, *p_, *ps, *pp;

	q = &q_head->q;
	assert(q == ptr_clear(q));
	n = ptr_clear(n);
	assert(n != NULL);

	p = deref(&n->pred);
	if (ptr_clear(p) == NULL)
		return p;

	for (;;) {
		/*
		 * Predecessor cannot be null,
		 * since it is on the queue and we have a reference to n,
		 * preventing it from leaving the queue.
		 */
		assert(ptr_clear(p) != NULL);

		/*
		 * Search forward to reach the direct predecessor of
		 * n between p and n.  Note that we cannot search for
		 * a better predecessor when p holds the deletion mark
		 * for n.
		 */
		if (!deleted_ptr(p)) {
			ps = succ(q_head, p);
			assert(ptr_clear(ps) != NULL);
			while (ptr_clear(ps) != n && !deleted_ptr(p)) {
				p_ = p;
				if (ptr_cas(&n->pred, &p_, ps)) {
					/* cas succeeded */
					deref_acquire(ps, 1);
					ptr_clear_deref(&n->pred);
					deref_release(q_head, p, 2);
					p = flag_combine(ps, p_);
				} else {
					/* cas failed */
					deref_release(q_head, ps, 1);
					deref_release(q_head, p, 1);

					/*
					 * Cannot do p = p_, since we do not
					 * have the lock on n->pred at the
					 * moment and thus cannot acquire the
					 * reference counter on p_.
					 */
					p = deref(&n->pred);
				}

				ps = succ(q_head, p);
			}
			deref_release(q_head, ps, 1);
		}

		/*
		 * p is the best predecessor, provided it is not a deleted value.
		 */
		if (!deleted(p))
			break;		/* GUARD */

		/*
		 * Skip to the predecessor of p, since p is deleted.
		 */
		pp = deref(&ptr_clear(p)->pred);
		p_ = p;
		if (ptr_cas(&n->pred, &p_, pp)) {
			/* cas succeeded */
			deref_acquire(pp, 1);
			ptr_clear_deref(&n->pred);
			deref_release(q_head, p, 2);
			p = pp;
		} else {
			/* cas failed */
			deref_release(q_head, p, 1);
			deref_release(q_head, pp, 1);
			p = deref(&n->pred);
		}
	}

	return flag_combine(p, (struct ll_elem*)atomic_load_explicit(&n->pred,
	    memory_order_relaxed));
}